

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countdown_latch.cpp
# Opt level: O2

void __thiscall bidfx_public_api::tools::CountdownLatch::CountDown(CountdownLatch *this)

{
  uint32_t uVar1;
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> uStack_18;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_18,&this->lock);
  if ((this->count == 0) || (uVar1 = this->count - 1, this->count = uVar1, uVar1 == 0)) {
    std::condition_variable::notify_all();
  }
  std::unique_lock<std::mutex>::~unique_lock(&uStack_18);
  return;
}

Assistant:

void CountdownLatch::CountDown()
{
    std::unique_lock<std::mutex> lck(lock);
    if (0 == count)
    {
        cv.notify_all();
        return;
    }
    --count;
    if (0 == count)
    {
        cv.notify_all();
    }
}